

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O3

void __thiscall
RenX_LoggingPlugin::RenX_OnAbductionCrate
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player)

{
  pointer pcVar1;
  code *pcVar2;
  string msg;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  if ((*(ulong *)&this->field_0xa0 >> 0x31 & 1) == 0) {
    pcVar2 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar2 = RenX::Server::sendLogChan;
  }
  pcVar1 = (this->abductionCrateFmt)._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (this->abductionCrateFmt)._M_string_length);
  if (local_40 != 0) {
    RenX::processTags((string *)&local_48,server,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
    (*pcVar2)(server,local_40,local_48);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnAbductionCrate(RenX::Server &server, const RenX::PlayerInfo &player)
{
	logFuncType func;
	if (RenX_LoggingPlugin::abductionCratePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->abductionCrateFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player);
		(server.*func)(msg);
	}
}